

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_block.cpp
# Opt level: O1

unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true> __thiscall
duckdb::SortedData::CreateSlice
          (SortedData *this,idx_t start_block_index,idx_t end_block_index,idx_t end_entry_index)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::RowDataBlock_*,_false> _Var2;
  SortedData *this_00;
  pointer pSVar3;
  reference pvVar4;
  pointer pRVar5;
  pointer *__ptr;
  pointer *__ptr_2;
  idx_t in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Head_base<0UL,_duckdb::RowDataBlock_*,_false> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  GlobalSortState *local_48;
  idx_t local_40;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_38;
  
  local_50._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(start_block_index + 0x98);
  local_48 = *(GlobalSortState **)(start_block_index + 0xa0);
  local_40 = in_R8;
  this_00 = (SortedData *)operator_new(0xa8);
  SortedData(this_00,*(SortedDataType *)start_block_index,(RowLayout *)(start_block_index + 8),
             (BufferManager *)local_50._M_pi,local_48);
  *(SortedData **)this = this_00;
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)end_block_index;
  if (end_block_index <= end_entry_index) {
    local_48 = (GlobalSortState *)(start_block_index + 0x60);
    local_38 = (vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                *)(start_block_index + 0x78);
    do {
      pSVar3 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
               operator->((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                           *)this);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                             *)local_48,end_block_index);
      unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::operator->
                (pvVar4);
      RowDataBlock::Copy((RowDataBlock *)&local_58);
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
                ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                  *)&pSVar3->data_blocks,
                 (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  *)&local_58);
      _Var2._M_head_impl = local_58._M_head_impl;
      if ((element_type *)local_58._M_head_impl != (element_type *)0x0) {
        p_Var6 = (((enable_shared_from_this<duckdb::BlockHandle> *)&(local_58._M_head_impl)->block)
                 ->__weak_this_).internal.
                 super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        operator_delete(_Var2._M_head_impl);
      }
      if ((*(char *)(start_block_index + 0x50) == '\0') &&
         (*(char *)(*(long *)(start_block_index + 0xa0) + 0x290) == '\x01')) {
        pSVar3 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                 operator->((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                             *)this);
        pvVar4 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::operator[](local_38,end_block_index);
        unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
        operator->(pvVar4);
        RowDataBlock::Copy((RowDataBlock *)&local_58);
        ::std::
        vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                    *)&pSVar3->heap_blocks,
                   (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    *)&local_58);
        _Var2._M_head_impl = local_58._M_head_impl;
        if ((element_type *)local_58._M_head_impl != (element_type *)0x0) {
          p_Var6 = (((enable_shared_from_this<duckdb::BlockHandle> *)&(local_58._M_head_impl)->block
                    )->__weak_this_).internal.
                   super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          operator_delete(_Var2._M_head_impl);
        }
      }
      end_block_index = end_block_index + 1;
    } while (end_block_index <= end_entry_index);
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                             *)(start_block_index + 0x60),(size_type)p_Var6);
      pRVar5 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(pvVar4);
      p_Var1 = (pRVar5->block).internal.
               super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (pRVar5->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (pRVar5->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if ((*(char *)(start_block_index + 0x50) == '\0') &&
         (*(char *)(*(long *)(start_block_index + 0xa0) + 0x290) == '\x01')) {
        pvVar4 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                               *)(start_block_index + 0x78),(size_type)p_Var6);
        pRVar5 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator->(pvVar4);
        p_Var1 = (pRVar5->block).internal.
                 super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (pRVar5->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        (pRVar5->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
      }
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var6->_vptr__Sp_counted_base + 1);
    } while (local_50._M_pi != p_Var6);
  }
  pSVar3 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::operator->
                     ((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                       *)this);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
           ::back(&pSVar3->data_blocks);
  pRVar5 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->(pvVar4);
  pRVar5->count = local_40;
  if ((*(char *)(start_block_index + 0x50) == '\0') &&
     (*(char *)(*(long *)(start_block_index + 0xa0) + 0x290) == '\x01')) {
    pSVar3 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
             operator->((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                         *)this);
    pvVar4 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::back(&pSVar3->heap_blocks);
    pRVar5 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar4);
    pRVar5->count = local_40;
  }
  return (unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>)
         (unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>)this;
}

Assistant:

unique_ptr<SortedData> SortedData::CreateSlice(idx_t start_block_index, idx_t end_block_index, idx_t end_entry_index) {
	// Add the corresponding blocks to the result
	auto result = make_uniq<SortedData>(type, layout, buffer_manager, state);
	for (idx_t i = start_block_index; i <= end_block_index; i++) {
		result->data_blocks.push_back(data_blocks[i]->Copy());
		if (!layout.AllConstant() && state.external) {
			result->heap_blocks.push_back(heap_blocks[i]->Copy());
		}
	}
	// All of the blocks that come before block with idx = start_block_idx can be reset (other references exist)
	for (idx_t i = 0; i < start_block_index; i++) {
		data_blocks[i]->block = nullptr;
		if (!layout.AllConstant() && state.external) {
			heap_blocks[i]->block = nullptr;
		}
	}
	// Use start and end entry indices to set the boundaries
	D_ASSERT(end_entry_index <= result->data_blocks.back()->count);
	result->data_blocks.back()->count = end_entry_index;
	if (!layout.AllConstant() && state.external) {
		result->heap_blocks.back()->count = end_entry_index;
	}
	return result;
}